

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O2

ON__UINT64 __thiscall
ON_SerialNumberMap::Internal_HashTableAddSerialNumberBlock
          (ON_SerialNumberMap *this,ON_SN_BLOCK *blk)

{
  uint uVar1;
  uint uVar2;
  SN_ELEMENT **ppSVar3;
  ulong uVar4;
  ON__UINT64 OVar5;
  SN_ELEMENT *pSVar6;
  uint uVar7;
  
  OVar5 = 0;
  if ((blk != (ON_SN_BLOCK *)0x0) && (this->m_bHashTableIsValid != '\0')) {
    uVar1 = blk->m_count;
    if (uVar1 <= blk->m_purged) {
      return 0;
    }
    pSVar6 = blk->m_sn;
    uVar2 = this->m_hash_block_count;
    if (uVar2 == 1) {
      ppSVar3 = *this->m_hash_table_blocks;
      uVar7 = 0;
      for (; pSVar6 < blk->m_sn + uVar1; pSVar6 = pSVar6 + 1) {
        if (pSVar6->m_id_active == '\0') {
          pSVar6->m_next = (SN_ELEMENT *)0x0;
        }
        else {
          uVar4 = ((ulong)pSVar6->m_id_crc32 / 0xffa) % 0xffa;
          pSVar6->m_next = ppSVar3[uVar4];
          ppSVar3[uVar4] = pSVar6;
          uVar7 = uVar7 + 1;
        }
      }
    }
    else {
      uVar7 = 0;
      for (; pSVar6 < blk->m_sn + uVar1; pSVar6 = pSVar6 + 1) {
        if (pSVar6->m_id_active == '\0') {
          pSVar6->m_next = (SN_ELEMENT *)0x0;
        }
        else {
          ppSVar3 = this->m_hash_table_blocks[(ulong)pSVar6->m_id_crc32 % (ulong)uVar2];
          uVar4 = ((ulong)pSVar6->m_id_crc32 / 0xffa) % 0xffa;
          pSVar6->m_next = ppSVar3[uVar4];
          ppSVar3[uVar4] = pSVar6;
          uVar7 = uVar7 + 1;
        }
      }
    }
    OVar5 = (ON__UINT64)uVar7;
  }
  return OVar5;
}

Assistant:

ON__UINT64 ON_SerialNumberMap::Internal_HashTableAddSerialNumberBlock( ON_SN_BLOCK* blk) const
{
  ON__UINT32 active_id_count = 0; // 4 bytes is enough for a single block

  if ( m_bHashTableIsValid && nullptr != blk && blk->m_purged < blk->m_count )
  {
    SN_ELEMENT* e = blk->m_sn;
    SN_ELEMENT* e1 = e + blk->m_count;
    struct SN_ELEMENT** hash_table_block;
    ON__UINT32 hash_i;
    if (1 == m_hash_block_count)
    {
      hash_table_block = m_hash_table_blocks[0];
      for (/* empty init */; e < e1; e++)
      {
        if (0 == e->m_id_active)
        {
          e->m_next = nullptr;
          continue;
        }
        hash_i = ON_SerialNumberMap::Internal_HashTableBlockRowIndex(e->m_id_crc32);
        e->m_next = hash_table_block[hash_i];
        hash_table_block[hash_i] = e;
        active_id_count++;
      }
    }
    else
    {
      for (/* empty init */; e < e1; e++)
      {
        if (0 == e->m_id_active)
        {
          e->m_next = nullptr;
          continue;
        }
        hash_table_block = Internal_HashTableBlock(e->m_id_crc32);
        hash_i = ON_SerialNumberMap::Internal_HashTableBlockRowIndex(e->m_id_crc32);
        e->m_next = hash_table_block[hash_i];
        hash_table_block[hash_i] = e;
        active_id_count++;
      }
    }
  }

  return (ON__UINT64)active_id_count; // entire map may contain many blocks and more than 2^32 entries.
}